

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::CopiesAndBlittingTestInstance
          (CopiesAndBlittingTestInstance *this,Context *context,TestParams *testParams)

{
  Move<vk::Handle<(vk::HandleType)24>_> *pMVar1;
  Move<vk::VkCommandBuffer_s_*> *pMVar2;
  pointer __src;
  VkCommandPool obj;
  VkCommandBuffer_s *pVVar3;
  DeviceInterface *pDVar4;
  VkFence obj_00;
  undefined8 uVar5;
  undefined8 uVar6;
  VkDeviceSize VVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Handle<(vk::HandleType)24> HVar10;
  VkDevice pVVar11;
  VkAllocationCallbacks *pVVar12;
  deUint32 queueFamilyIndex;
  pointer __dest;
  DeviceInterface *vk;
  VkDevice device;
  long lVar13;
  size_t __n;
  Move<vk::Handle<(vk::HandleType)24>_> local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Move<vk::Handle<(vk::HandleType)6>_> *local_40;
  VkCommandBuffer_s *local_38;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__CopiesAndBlittingTestInstance_00cf03f0;
  uVar5 = *(undefined8 *)((long)&testParams->src + 8);
  uVar6 = *(undefined8 *)((long)&testParams->src + 0x10);
  VVar7 = (testParams->dst).buffer.size;
  uVar8 = *(undefined8 *)((long)&testParams->dst + 8);
  uVar9 = *(undefined8 *)((long)&testParams->dst + 0x10);
  (this->m_params).src.buffer.size = (testParams->src).buffer.size;
  *(undefined8 *)((long)&(this->m_params).src + 8) = uVar5;
  *(undefined8 *)((long)&(this->m_params).src + 0x10) = uVar6;
  (this->m_params).dst.buffer.size = VVar7;
  *(undefined8 *)((long)&(this->m_params).dst + 8) = uVar8;
  *(undefined8 *)((long)&(this->m_params).dst + 0x10) = uVar9;
  lVar13 = (long)(testParams->regions).
                 super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(testParams->regions).
                 super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __dest = std::
           _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
           ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                          *)((lVar13 >> 4) * -0x3333333333333333),(size_t)context);
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_start = __dest;
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = __dest;
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar13 + (long)__dest);
  __src = (testParams->regions).
          super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
          ._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(testParams->regions).
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove(__dest,__src,__n);
  }
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__dest + __n);
  (this->m_params).field_3 = testParams->field_3;
  pMVar1 = &this->m_cmdPool;
  pMVar2 = &this->m_cmdBuffer;
  local_40 = &this->m_fence;
  (this->m_destinationTextureLevel).
  super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)0x0;
  (this->m_expectedTextureLevel).
  super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_sourceTextureLevel).
  super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)0x0;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createCommandPool(&local_88,vk,device,2,queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  pVVar12 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  pVVar11 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pDVar4 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  HVar10.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_58 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  uStack_50 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_68 = (VkCommandBuffer_s *)
             local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  uStack_60 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal
  ;
  if (obj.m_internal == 0) {
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         pVVar11;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         pVVar12;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
         HVar10.m_internal;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         pDVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,obj)
    ;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         local_58;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         uStack_50;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
         (deUint64)local_68;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         uStack_60;
    if (local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                (&local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                 (VkCommandPool)
                 local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
    }
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_88,vk,device,
             (VkCommandPool)
             (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  pVVar12 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  pVVar11 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pDVar4 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  HVar10.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_58 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  uStack_50 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_68 = (VkCommandBuffer_s *)
             local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  uStack_60 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pVVar3 = (pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
  if (pVVar3 == (VkCommandBuffer_s *)0x0) {
    (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = pVVar11;
    (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
         (deUint64)pVVar12;
    (pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object =
         (VkCommandBuffer_s *)HVar10.m_internal;
    (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface = pDVar4
    ;
  }
  else {
    pDVar4 = (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
    ;
    local_38 = pVVar3;
    (*pDVar4->_vptr_DeviceInterface[0x48])
              (pDVar4,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                      m_device,
               (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal);
    *(undefined4 *)
     &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
         (undefined4)local_58;
    *(undefined4 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device + 4)
         = local_58._4_4_;
    *(undefined4 *)
     &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
         (undefined4)uStack_50;
    *(undefined4 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
             m_internal + 4) = uStack_50._4_4_;
    *(undefined4 *)&(pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object =
         (undefined4)local_68;
    *(undefined4 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + 4) =
         local_68._4_4_;
    *(undefined4 *)
     &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         (undefined4)uStack_60;
    *(undefined4 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
     + 4) = uStack_60._4_4_;
    if ((VkCommandBuffer_s *)
        local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
        (VkCommandBuffer_s *)0x0) {
      local_68 = (VkCommandBuffer_s *)
                 local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
      (*(local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x48])
                (local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                 m_deviceIface,
                 local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
                 local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator)
      ;
    }
  }
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_88,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  pVVar12 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  pVVar11 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pDVar4 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  HVar10.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_58 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  uStack_50 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_68 = (VkCommandBuffer_s *)
             local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  uStack_60 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (local_40->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal;
  if (obj_00.m_internal == 0) {
    (local_40->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_device = pVVar11;
    (local_40->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_allocator = pVVar12;
    (local_40->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal =
         HVar10.m_internal;
    (local_40->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_deviceIface = pDVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,obj_00)
    ;
    (local_40->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_device = local_58;
    (local_40->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_allocator = uStack_50
    ;
    (local_40->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal =
         (deUint64)local_68;
    (local_40->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_deviceIface =
         uStack_60;
    if (local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)6>_> *)
                 &local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                 (VkFence)local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                          m_internal);
    }
  }
  return;
}

Assistant:

CopiesAndBlittingTestInstance::CopiesAndBlittingTestInstance (Context& context, TestParams testParams)
	: vkt::TestInstance	(context)
	, m_params			(testParams)
{
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const VkDevice				vkDevice			= context.getDevice();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();

	// Create command pool
	m_cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);

	// Create command buffer
	m_cmdBuffer = allocateCommandBuffer(vk, vkDevice, *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	m_fence = createFence(vk, vkDevice);
}